

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddBtreeIndex
              (WhereLoopBuilder *pBuilder,SrcList_item *pSrc,Index *pProbe,LogEst nInMul)

{
  ushort uVar1;
  u16 uVar2;
  u16 uVar3;
  ushort uVar4;
  u16 uVar5;
  LogEst LVar6;
  LogEst N;
  ushort uVar7;
  u32 uVar8;
  Parse *pParse_00;
  sqlite3 *db_00;
  WhereLoop *p;
  ulong uVar9;
  Expr *pEVar10;
  LogEst a;
  LogEst LVar11;
  ushort uVar12;
  short sVar13;
  int iVar14;
  WhereTerm *local_140;
  LogEst nIter;
  int nEq;
  int iCol;
  int iStack_124;
  LogEst safetyMargin;
  LogEst logK;
  LogEst M;
  int i;
  Expr *pExpr;
  int nIn;
  LogEst nOutUnadjusted;
  LogEst rCostIdx;
  WhereTerm *pWStack_108;
  u16 eOp;
  WhereTerm *pBtm;
  WhereTerm *pTop;
  int local_f0;
  LogEst rLogSize;
  LogEst rSize;
  int rc;
  LogEst saved_nOut;
  u32 saved_wsFlags;
  u16 saved_nSkip;
  u16 saved_nTop;
  u16 saved_nBtm;
  u16 saved_nEq;
  u16 saved_nLTerm;
  Bitmask saved_prereq;
  WhereScan scan;
  WhereTerm *pWStack_58;
  int opMask;
  WhereTerm *pTerm;
  WhereLoop *pNew;
  sqlite3 *db;
  Parse *pParse;
  WhereInfo *pWInfo;
  LogEst nInMul_local;
  Index *pProbe_local;
  SrcList_item *pSrc_local;
  WhereLoopBuilder *pBuilder_local;
  
  pParse_00 = pBuilder->pWInfo->pParse;
  db_00 = pParse_00->db;
  local_f0 = 0;
  pBtm = (WhereTerm *)0x0;
  pWStack_108 = (WhereTerm *)0x0;
  p = pBuilder->pNew;
  if (db_00->mallocFailed == '\0') {
    if ((p->wsFlags & 0x20) == 0) {
      scan.aiColumn[10] = 0x1bf;
      scan._110_2_ = 0;
    }
    else {
      scan.aiColumn[10] = 0x18;
      scan._110_2_ = 0;
    }
    if ((*(ushort *)&pProbe->field_0x63 >> 2 & 1) != 0) {
      scan._108_4_ = scan._108_4_ & 0xffffffc3;
    }
    uVar1 = (p->u).btree.nEq;
    uVar2 = (p->u).btree.nBtm;
    uVar3 = (p->u).btree.nTop;
    uVar4 = p->nSkip;
    uVar5 = p->nLTerm;
    uVar8 = p->wsFlags;
    uVar9 = p->prereq;
    LVar6 = p->nOut;
    pWStack_58 = whereScanInit((WhereScan *)&saved_prereq,pBuilder->pWC,pSrc->iCursor,(uint)uVar1,
                               scan._108_4_,pProbe);
    p->rSetup = 0;
    N = *pProbe->aiRowLogEst;
    a = estLog(N);
    while (local_f0 == 0 && pWStack_58 != (WhereTerm *)0x0) {
      uVar7 = pWStack_58->eOperator;
      pExpr._4_4_ = 0;
      if (((((uVar7 != 0x100) || (iVar14 = indexColumnNotNull(pProbe,(uint)uVar1), iVar14 == 0)) &&
           ((pWStack_58->prereqRight & p->maskSelf) == 0)) &&
          (((pWStack_58->wtFlags & 0x100) == 0 || (pWStack_58->eOperator != 0x10)))) &&
         ((((pSrc->fg).jointype & 8) == 0 || ((pWStack_58->pExpr->flags & 1) != 0)))) {
        if ((pProbe->onError == '\0') || ((uint)uVar1 != pProbe->nKeyCol - 1)) {
          pBuilder->bldFlags = pBuilder->bldFlags | 1;
        }
        else {
          pBuilder->bldFlags = pBuilder->bldFlags | 2;
        }
        p->wsFlags = uVar8;
        (p->u).btree.nEq = uVar1;
        (p->u).btree.nBtm = uVar2;
        (p->u).btree.nTop = uVar3;
        p->nLTerm = uVar5;
        iVar14 = whereLoopResize(db_00,p,p->nLTerm + 1);
        if (iVar14 != 0) break;
        uVar12 = p->nLTerm;
        p->nLTerm = uVar12 + 1;
        p->aLTerm[uVar12] = pWStack_58;
        p->prereq = (uVar9 | pWStack_58->prereqRight) & (p->maskSelf ^ 0xffffffffffffffff);
        if ((uVar7 & 1) == 0) {
          if ((uVar7 & 0x82) == 0) {
            if ((uVar7 & 0x100) == 0) {
              if ((uVar7 & 0x24) == 0) {
                p->wsFlags = p->wsFlags | 0x12;
                iVar14 = whereRangeVectorLen(pParse_00,pSrc->iCursor,pProbe,(uint)uVar1,pWStack_58);
                (p->u).btree.nTop = (u16)iVar14;
                pBtm = pWStack_58;
                if ((p->wsFlags & 0x20) == 0) {
                  local_140 = (WhereTerm *)0x0;
                }
                else {
                  local_140 = p->aLTerm[(int)(p->nLTerm - 2)];
                }
                pWStack_108 = local_140;
              }
              else {
                p->wsFlags = p->wsFlags | 0x22;
                iVar14 = whereRangeVectorLen(pParse_00,pSrc->iCursor,pProbe,(uint)uVar1,pWStack_58);
                (p->u).btree.nBtm = (u16)iVar14;
                pWStack_108 = pWStack_58;
                pBtm = (WhereTerm *)0x0;
                if ((pWStack_58->wtFlags & 0x100) != 0) {
                  pBtm = pWStack_58 + 1;
                  iVar14 = whereLoopResize(db_00,p,p->nLTerm + 1);
                  if (iVar14 != 0) break;
                  uVar12 = p->nLTerm;
                  p->nLTerm = uVar12 + 1;
                  p->aLTerm[uVar12] = pBtm;
                  p->wsFlags = p->wsFlags | 0x10;
                  (p->u).btree.nTop = 1;
                }
              }
            }
            else {
              p->wsFlags = p->wsFlags | 8;
            }
          }
          else {
            sVar13 = pProbe->aiColumn[uVar1];
            p->wsFlags = p->wsFlags | 1;
            if ((sVar13 == -1) ||
               (((-1 < sVar13 && (nInMul == 0)) && ((uint)uVar1 == pProbe->nKeyCol - 1)))) {
              if (((sVar13 == -1) || ((*(ushort *)&pProbe->field_0x63 >> 3 & 1) != 0)) ||
                 ((pProbe->nKeyCol == 1 && ((pProbe->onError != '\0' && (uVar7 == 2)))))) {
                p->wsFlags = p->wsFlags | 0x1000;
              }
              else {
                p->wsFlags = p->wsFlags | 0x10000;
              }
            }
          }
        }
        else {
          pEVar10 = pWStack_58->pExpr;
          if ((pEVar10->flags & 0x800) == 0) {
            if (((pEVar10->x).pList != (ExprList *)0x0) && (((pEVar10->x).pList)->nExpr != 0)) {
              LVar11 = sqlite3LogEst((long)((pEVar10->x).pList)->nExpr);
              pExpr._4_4_ = (int)LVar11;
            }
          }
          else {
            pExpr._4_4_ = 0x2e;
            for (iStack_124 = 0; iStack_124 < (int)(p->nLTerm - 1); iStack_124 = iStack_124 + 1) {
              if ((p->aLTerm[iStack_124] != (WhereTerm *)0x0) &&
                 (p->aLTerm[iStack_124]->pExpr == pEVar10)) {
                pExpr._4_4_ = 0;
              }
            }
          }
          if (((*(ushort *)&pProbe->field_0x63 >> 7 & 1) != 0) &&
             (sVar13 = pProbe->aiRowLogEst[uVar1], LVar11 = estLog((LogEst)pExpr._4_4_),
             (int)sVar13 + (int)LVar11 + 10 < pExpr._4_4_ + a)) goto LAB_001dceee;
          p->wsFlags = p->wsFlags | 4;
        }
        sVar13 = (short)pExpr._4_4_;
        if ((p->wsFlags & 2) == 0) {
          uVar12 = (p->u).btree.nEq + 1;
          (p->u).btree.nEq = uVar12;
          if ((pWStack_58->truthProb < 1) && (-1 < pProbe->aiColumn[uVar1])) {
            p->nOut = p->nOut + pWStack_58->truthProb;
            p->nOut = p->nOut - sVar13;
          }
          else {
            p->nOut = p->nOut + (pProbe->aiRowLogEst[(int)(uint)uVar12] -
                                pProbe->aiRowLogEst[(int)(uVar12 - 1)]);
            if ((uVar7 & 0x100) != 0) {
              p->nOut = p->nOut + 10;
            }
          }
        }
        else {
          whereRangeScanEst(pParse_00,pBuilder,pWStack_108,pBtm,p);
        }
        LVar11 = sqlite3LogEstAdd(a,p->nOut + 1 +
                                    (short)((pProbe->szIdxRow * 0xf) / (int)pSrc->pTab->szTabRow));
        p->rRun = LVar11;
        if ((p->wsFlags & 0x140) == 0) {
          LVar11 = sqlite3LogEstAdd(p->rRun,p->nOut + 0x10);
          p->rRun = LVar11;
        }
        LVar11 = p->nOut;
        p->rRun = p->rRun + nInMul + sVar13;
        p->nOut = p->nOut + nInMul + sVar13;
        whereLoopOutputAdjust(pBuilder->pWC,p,N);
        local_f0 = whereLoopInsert(pBuilder,p);
        if ((p->wsFlags & 2) == 0) {
          p->nOut = LVar11;
        }
        else {
          p->nOut = LVar6;
        }
        if (((p->wsFlags & 0x10) == 0) && ((p->u).btree.nEq < pProbe->nColumn)) {
          whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,nInMul + sVar13);
        }
        p->nOut = LVar6;
      }
LAB_001dceee:
      pWStack_58 = whereScanNext((WhereScan *)&saved_prereq);
    }
    p->prereq = uVar9;
    (p->u).btree.nEq = uVar1;
    (p->u).btree.nBtm = uVar2;
    (p->u).btree.nTop = uVar3;
    p->nSkip = uVar4;
    p->wsFlags = uVar8;
    p->nOut = LVar6;
    p->nLTerm = uVar5;
    if ((((uVar1 == uVar4) && (uVar1 + 1 < (uint)pProbe->nKeyCol)) &&
        ((*(ushort *)&pProbe->field_0x63 >> 6 & 1) == 0)) &&
       ((((db_00->dbOptFlags & 0x4000) == 0 && (0x29 < pProbe->aiRowLogEst[(int)(uVar1 + 1)])) &&
        (local_f0 = whereLoopResize(db_00,p,p->nLTerm + 1), local_f0 == 0)))) {
      (p->u).btree.nEq = (p->u).btree.nEq + 1;
      p->nSkip = p->nSkip + 1;
      uVar7 = p->nLTerm;
      p->nLTerm = uVar7 + 1;
      p->aLTerm[uVar7] = (WhereTerm *)0x0;
      p->wsFlags = p->wsFlags | 0x8000;
      sVar13 = pProbe->aiRowLogEst[uVar1] - pProbe->aiRowLogEst[(int)(uVar1 + 1)];
      p->nOut = p->nOut - sVar13;
      whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,sVar13 + 5 + nInMul);
      p->nOut = LVar6;
      (p->u).btree.nEq = uVar1;
      p->nSkip = uVar4;
      p->wsFlags = uVar8;
    }
    pBuilder_local._4_4_ = local_f0;
  }
  else {
    pBuilder_local._4_4_ = 7;
  }
  return pBuilder_local._4_4_;
}

Assistant:

static int whereLoopAddBtreeIndex(
  WhereLoopBuilder *pBuilder,     /* The WhereLoop factory */
  struct SrcList_item *pSrc,      /* FROM clause term being analyzed */
  Index *pProbe,                  /* An index on pSrc */
  LogEst nInMul                   /* log(Number of iterations due to IN) */
){
  WhereInfo *pWInfo = pBuilder->pWInfo;  /* WHERE analyse context */
  Parse *pParse = pWInfo->pParse;        /* Parsing context */
  sqlite3 *db = pParse->db;       /* Database connection malloc context */
  WhereLoop *pNew;                /* Template WhereLoop under construction */
  WhereTerm *pTerm;               /* A WhereTerm under consideration */
  int opMask;                     /* Valid operators for constraints */
  WhereScan scan;                 /* Iterator for WHERE terms */
  Bitmask saved_prereq;           /* Original value of pNew->prereq */
  u16 saved_nLTerm;               /* Original value of pNew->nLTerm */
  u16 saved_nEq;                  /* Original value of pNew->u.btree.nEq */
  u16 saved_nBtm;                 /* Original value of pNew->u.btree.nBtm */
  u16 saved_nTop;                 /* Original value of pNew->u.btree.nTop */
  u16 saved_nSkip;                /* Original value of pNew->nSkip */
  u32 saved_wsFlags;              /* Original value of pNew->wsFlags */
  LogEst saved_nOut;              /* Original value of pNew->nOut */
  int rc = SQLITE_OK;             /* Return code */
  LogEst rSize;                   /* Number of rows in the table */
  LogEst rLogSize;                /* Logarithm of table size */
  WhereTerm *pTop = 0, *pBtm = 0; /* Top and bottom range constraints */

  pNew = pBuilder->pNew;
  if( db->mallocFailed ) return SQLITE_NOMEM_BKPT;
  WHERETRACE(0x800, ("BEGIN %s.addBtreeIdx(%s), nEq=%d\n",
                     pProbe->pTable->zName,pProbe->zName, pNew->u.btree.nEq));

  assert( (pNew->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pNew->wsFlags & WHERE_TOP_LIMIT)==0 );
  if( pNew->wsFlags & WHERE_BTM_LIMIT ){
    opMask = WO_LT|WO_LE;
  }else{
    assert( pNew->u.btree.nBtm==0 );
    opMask = WO_EQ|WO_IN|WO_GT|WO_GE|WO_LT|WO_LE|WO_ISNULL|WO_IS;
  }
  if( pProbe->bUnordered ) opMask &= ~(WO_GT|WO_GE|WO_LT|WO_LE);

  assert( pNew->u.btree.nEq<pProbe->nColumn );

  saved_nEq = pNew->u.btree.nEq;
  saved_nBtm = pNew->u.btree.nBtm;
  saved_nTop = pNew->u.btree.nTop;
  saved_nSkip = pNew->nSkip;
  saved_nLTerm = pNew->nLTerm;
  saved_wsFlags = pNew->wsFlags;
  saved_prereq = pNew->prereq;
  saved_nOut = pNew->nOut;
  pTerm = whereScanInit(&scan, pBuilder->pWC, pSrc->iCursor, saved_nEq,
                        opMask, pProbe);
  pNew->rSetup = 0;
  rSize = pProbe->aiRowLogEst[0];
  rLogSize = estLog(rSize);
  for(; rc==SQLITE_OK && pTerm!=0; pTerm = whereScanNext(&scan)){
    u16 eOp = pTerm->eOperator;   /* Shorthand for pTerm->eOperator */
    LogEst rCostIdx;
    LogEst nOutUnadjusted;        /* nOut before IN() and WHERE adjustments */
    int nIn = 0;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    int nRecValid = pBuilder->nRecValid;
#endif
    if( (eOp==WO_ISNULL || (pTerm->wtFlags&TERM_VNULL)!=0)
     && indexColumnNotNull(pProbe, saved_nEq)
    ){
      continue; /* ignore IS [NOT] NULL constraints on NOT NULL columns */
    }
    if( pTerm->prereqRight & pNew->maskSelf ) continue;

    /* Do not allow the upper bound of a LIKE optimization range constraint
    ** to mix with a lower range bound from some other source */
    if( pTerm->wtFlags & TERM_LIKEOPT && pTerm->eOperator==WO_LT ) continue;

    /* Do not allow constraints from the WHERE clause to be used by the
    ** right table of a LEFT JOIN.  Only constraints in the ON clause are
    ** allowed */
    if( (pSrc->fg.jointype & JT_LEFT)!=0
     && !ExprHasProperty(pTerm->pExpr, EP_FromJoin)
    ){
      continue;
    }

    if( IsUniqueIndex(pProbe) && saved_nEq==pProbe->nKeyCol-1 ){
      pBuilder->bldFlags |= SQLITE_BLDF_UNIQUE;
    }else{
      pBuilder->bldFlags |= SQLITE_BLDF_INDEXED;
    }
    pNew->wsFlags = saved_wsFlags;
    pNew->u.btree.nEq = saved_nEq;
    pNew->u.btree.nBtm = saved_nBtm;
    pNew->u.btree.nTop = saved_nTop;
    pNew->nLTerm = saved_nLTerm;
    if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
    pNew->aLTerm[pNew->nLTerm++] = pTerm;
    pNew->prereq = (saved_prereq | pTerm->prereqRight) & ~pNew->maskSelf;

    assert( nInMul==0
        || (pNew->wsFlags & WHERE_COLUMN_NULL)!=0 
        || (pNew->wsFlags & WHERE_COLUMN_IN)!=0 
        || (pNew->wsFlags & WHERE_SKIPSCAN)!=0 
    );

    if( eOp & WO_IN ){
      Expr *pExpr = pTerm->pExpr;
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* "x IN (SELECT ...)":  TUNING: the SELECT returns 25 rows */
        int i;
        nIn = 46;  assert( 46==sqlite3LogEst(25) );

        /* The expression may actually be of the form (x, y) IN (SELECT...).
        ** In this case there is a separate term for each of (x) and (y).
        ** However, the nIn multiplier should only be applied once, not once
        ** for each such term. The following loop checks that pTerm is the
        ** first such term in use, and sets nIn back to 0 if it is not. */
        for(i=0; i<pNew->nLTerm-1; i++){
          if( pNew->aLTerm[i] && pNew->aLTerm[i]->pExpr==pExpr ) nIn = 0;
        }
      }else if( ALWAYS(pExpr->x.pList && pExpr->x.pList->nExpr) ){
        /* "x IN (value, value, ...)" */
        nIn = sqlite3LogEst(pExpr->x.pList->nExpr);
        assert( nIn>0 );  /* RHS always has 2 or more terms...  The parser
                          ** changes "x IN (?)" into "x=?". */
      }
      if( pProbe->hasStat1 ){
        LogEst M, logK, safetyMargin;
        /* Let:
        **   N = the total number of rows in the table
        **   K = the number of entries on the RHS of the IN operator
        **   M = the number of rows in the table that match terms to the 
        **       to the left in the same index.  If the IN operator is on
        **       the left-most index column, M==N.
        **
        ** Given the definitions above, it is better to omit the IN operator
        ** from the index lookup and instead do a scan of the M elements,
        ** testing each scanned row against the IN operator separately, if:
        **
        **        M*log(K) < K*log(N)
        **
        ** Our estimates for M, K, and N might be inaccurate, so we build in
        ** a safety margin of 2 (LogEst: 10) that favors using the IN operator
        ** with the index, as using an index has better worst-case behavior.
        ** If we do not have real sqlite_stat1 data, always prefer to use
        ** the index.
        */
        M = pProbe->aiRowLogEst[saved_nEq];
        logK = estLog(nIn);
        safetyMargin = 10;  /* TUNING: extra weight for indexed IN */
        if( M + logK + safetyMargin < nIn + rLogSize ){
          WHERETRACE(0x40,
            ("Scan preferred over IN operator on column %d of \"%s\" (%d<%d)\n",
             saved_nEq, pProbe->zName, M+logK+10, nIn+rLogSize));
          continue;
        }else{
          WHERETRACE(0x40,
            ("IN operator preferred on column %d of \"%s\" (%d>=%d)\n",
             saved_nEq, pProbe->zName, M+logK+10, nIn+rLogSize));
        }
      }
      pNew->wsFlags |= WHERE_COLUMN_IN;
    }else if( eOp & (WO_EQ|WO_IS) ){
      int iCol = pProbe->aiColumn[saved_nEq];
      pNew->wsFlags |= WHERE_COLUMN_EQ;
      assert( saved_nEq==pNew->u.btree.nEq );
      if( iCol==XN_ROWID 
       || (iCol>=0 && nInMul==0 && saved_nEq==pProbe->nKeyCol-1)
      ){
        if( iCol==XN_ROWID || pProbe->uniqNotNull 
         || (pProbe->nKeyCol==1 && pProbe->onError && eOp==WO_EQ) 
        ){
          pNew->wsFlags |= WHERE_ONEROW;
        }else{
          pNew->wsFlags |= WHERE_UNQ_WANTED;
        }
      }
    }else if( eOp & WO_ISNULL ){
      pNew->wsFlags |= WHERE_COLUMN_NULL;
    }else if( eOp & (WO_GT|WO_GE) ){
      testcase( eOp & WO_GT );
      testcase( eOp & WO_GE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_BTM_LIMIT;
      pNew->u.btree.nBtm = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pBtm = pTerm;
      pTop = 0;
      if( pTerm->wtFlags & TERM_LIKEOPT ){
        /* Range contraints that come from the LIKE optimization are
        ** always used in pairs. */
        pTop = &pTerm[1];
        assert( (pTop-(pTerm->pWC->a))<pTerm->pWC->nTerm );
        assert( pTop->wtFlags & TERM_LIKEOPT );
        assert( pTop->eOperator==WO_LT );
        if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
        pNew->aLTerm[pNew->nLTerm++] = pTop;
        pNew->wsFlags |= WHERE_TOP_LIMIT;
        pNew->u.btree.nTop = 1;
      }
    }else{
      assert( eOp & (WO_LT|WO_LE) );
      testcase( eOp & WO_LT );
      testcase( eOp & WO_LE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_TOP_LIMIT;
      pNew->u.btree.nTop = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pTop = pTerm;
      pBtm = (pNew->wsFlags & WHERE_BTM_LIMIT)!=0 ?
                     pNew->aLTerm[pNew->nLTerm-2] : 0;
    }

    /* At this point pNew->nOut is set to the number of rows expected to
    ** be visited by the index scan before considering term pTerm, or the
    ** values of nIn and nInMul. In other words, assuming that all 
    ** "x IN(...)" terms are replaced with "x = ?". This block updates
    ** the value of pNew->nOut to account for pTerm (but not nIn/nInMul).  */
    assert( pNew->nOut==saved_nOut );
    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      /* Adjust nOut using stat3/stat4 data. Or, if there is no stat3/stat4
      ** data, using some other estimate.  */
      whereRangeScanEst(pParse, pBuilder, pBtm, pTop, pNew);
    }else{
      int nEq = ++pNew->u.btree.nEq;
      assert( eOp & (WO_ISNULL|WO_EQ|WO_IN|WO_IS) );

      assert( pNew->nOut==saved_nOut );
      if( pTerm->truthProb<=0 && pProbe->aiColumn[saved_nEq]>=0 ){
        assert( (eOp & WO_IN) || nIn==0 );
        testcase( eOp & WO_IN );
        pNew->nOut += pTerm->truthProb;
        pNew->nOut -= nIn;
      }else{
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
        tRowcnt nOut = 0;
        if( nInMul==0 
         && pProbe->nSample 
         && pNew->u.btree.nEq<=pProbe->nSampleCol
         && ((eOp & WO_IN)==0 || !ExprHasProperty(pTerm->pExpr, EP_xIsSelect))
         && OptimizationEnabled(db, SQLITE_Stat34)
        ){
          Expr *pExpr = pTerm->pExpr;
          if( (eOp & (WO_EQ|WO_ISNULL|WO_IS))!=0 ){
            testcase( eOp & WO_EQ );
            testcase( eOp & WO_IS );
            testcase( eOp & WO_ISNULL );
            rc = whereEqualScanEst(pParse, pBuilder, pExpr->pRight, &nOut);
          }else{
            rc = whereInScanEst(pParse, pBuilder, pExpr->x.pList, &nOut);
          }
          if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
          if( rc!=SQLITE_OK ) break;          /* Jump out of the pTerm loop */
          if( nOut ){
            pNew->nOut = sqlite3LogEst(nOut);
            if( pNew->nOut>saved_nOut ) pNew->nOut = saved_nOut;
            pNew->nOut -= nIn;
          }
        }
        if( nOut==0 )
#endif
        {
          pNew->nOut += (pProbe->aiRowLogEst[nEq] - pProbe->aiRowLogEst[nEq-1]);
          if( eOp & WO_ISNULL ){
            /* TUNING: If there is no likelihood() value, assume that a 
            ** "col IS NULL" expression matches twice as many rows 
            ** as (col=?). */
            pNew->nOut += 10;
          }
        }
      }
    }

    /* Set rCostIdx to the cost of visiting selected rows in index. Add
    ** it to pNew->rRun, which is currently set to the cost of the index
    ** seek only. Then, if this is a non-covering index, add the cost of
    ** visiting the rows in the main table.  */
    rCostIdx = pNew->nOut + 1 + (15*pProbe->szIdxRow)/pSrc->pTab->szTabRow;
    pNew->rRun = sqlite3LogEstAdd(rLogSize, rCostIdx);
    if( (pNew->wsFlags & (WHERE_IDX_ONLY|WHERE_IPK))==0 ){
      pNew->rRun = sqlite3LogEstAdd(pNew->rRun, pNew->nOut + 16);
    }
    ApplyCostMultiplier(pNew->rRun, pProbe->pTable->costMult);

    nOutUnadjusted = pNew->nOut;
    pNew->rRun += nInMul + nIn;
    pNew->nOut += nInMul + nIn;
    whereLoopOutputAdjust(pBuilder->pWC, pNew, rSize);
    rc = whereLoopInsert(pBuilder, pNew);

    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      pNew->nOut = saved_nOut;
    }else{
      pNew->nOut = nOutUnadjusted;
    }

    if( (pNew->wsFlags & WHERE_TOP_LIMIT)==0
     && pNew->u.btree.nEq<pProbe->nColumn
    ){
      whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nInMul+nIn);
    }
    pNew->nOut = saved_nOut;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    pBuilder->nRecValid = nRecValid;
#endif
  }
  pNew->prereq = saved_prereq;
  pNew->u.btree.nEq = saved_nEq;
  pNew->u.btree.nBtm = saved_nBtm;
  pNew->u.btree.nTop = saved_nTop;
  pNew->nSkip = saved_nSkip;
  pNew->wsFlags = saved_wsFlags;
  pNew->nOut = saved_nOut;
  pNew->nLTerm = saved_nLTerm;

  /* Consider using a skip-scan if there are no WHERE clause constraints
  ** available for the left-most terms of the index, and if the average
  ** number of repeats in the left-most terms is at least 18. 
  **
  ** The magic number 18 is selected on the basis that scanning 17 rows
  ** is almost always quicker than an index seek (even though if the index
  ** contains fewer than 2^17 rows we assume otherwise in other parts of
  ** the code). And, even if it is not, it should not be too much slower. 
  ** On the other hand, the extra seeks could end up being significantly
  ** more expensive.  */
  assert( 42==sqlite3LogEst(18) );
  if( saved_nEq==saved_nSkip
   && saved_nEq+1<pProbe->nKeyCol
   && pProbe->noSkipScan==0
   && OptimizationEnabled(db, SQLITE_SkipScan)
   && pProbe->aiRowLogEst[saved_nEq+1]>=42  /* TUNING: Minimum for skip-scan */
   && (rc = whereLoopResize(db, pNew, pNew->nLTerm+1))==SQLITE_OK
  ){
    LogEst nIter;
    pNew->u.btree.nEq++;
    pNew->nSkip++;
    pNew->aLTerm[pNew->nLTerm++] = 0;
    pNew->wsFlags |= WHERE_SKIPSCAN;
    nIter = pProbe->aiRowLogEst[saved_nEq] - pProbe->aiRowLogEst[saved_nEq+1];
    pNew->nOut -= nIter;
    /* TUNING:  Because uncertainties in the estimates for skip-scan queries,
    ** add a 1.375 fudge factor to make skip-scan slightly less likely. */
    nIter += 5;
    whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nIter + nInMul);
    pNew->nOut = saved_nOut;
    pNew->u.btree.nEq = saved_nEq;
    pNew->nSkip = saved_nSkip;
    pNew->wsFlags = saved_wsFlags;
  }

  WHERETRACE(0x800, ("END %s.addBtreeIdx(%s), nEq=%d, rc=%d\n",
                      pProbe->pTable->zName, pProbe->zName, saved_nEq, rc));
  return rc;
}